

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::CompilerGLSL::to_trivial_mix_op
          (CompilerGLSL *this,SPIRType *type,string *op,uint32_t left,uint32_t right,uint32_t lerp)

{
  double dVar1;
  uint uVar2;
  Variant *pVVar3;
  ulong uVar4;
  bool bVar5;
  SPIRConstant *pSVar6;
  SPIRType *pSVar7;
  SPIRType *type_00;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  SPIRConstant *local_58;
  string local_50;
  
  uVar8 = (ulong)right;
  uVar4 = (ulong)left;
  if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
               buffer_size) &&
     (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar3[uVar4].type == TypeConstant)) {
    pSVar6 = Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar3 + uVar4);
  }
  else {
    pSVar6 = (SPIRConstant *)0x0;
  }
  if ((uVar8 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
               buffer_size) &&
     (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar3[uVar8].type == TypeConstant)) {
    local_58 = Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar3 + uVar8);
  }
  else {
    local_58 = (SPIRConstant *)0x0;
  }
  pSVar7 = Compiler::expression_type(&this->super_Compiler,lerp);
  if (pSVar6 == (SPIRConstant *)0x0) {
    return false;
  }
  if (local_58 == (SPIRConstant *)0x0) {
    return false;
  }
  if ((pSVar6->specialization == false) && (local_58->specialization == false)) {
    type_00 = Variant::get<diligent_spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.
                         super_VectorView<diligent_spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar6->super_IVariant).field_0xc);
    if (pSVar7->basetype != Boolean) {
      return false;
    }
    if (type_00->basetype == Struct) {
      return false;
    }
    bVar5 = Compiler::is_array(&this->super_Compiler,type_00);
    if (!bVar5) {
      if ((this->backend).use_constructor_splatting == false) {
        if (type_00->vecsize != pSVar7->vecsize) {
          return false;
        }
        if (1 < type_00->columns) {
          return false;
        }
      }
      else if (1 < type_00->columns) {
        return false;
      }
      if ((ulong)type_00->vecsize == 0) {
        bVar5 = true;
      }
      else {
        uVar8 = 1;
        do {
          bVar5 = false;
          switch(type->basetype) {
          case Short:
          case UShort:
            if (*(short *)((pSVar6->m).c[0].r + (uVar8 - 1)) != 0) goto LAB_00751e6e;
            bVar5 = *(short *)((local_58->m).c[0].r + (uVar8 - 1)) == 1;
            break;
          case Int:
          case UInt:
            if ((pSVar6->m).c[0].r[uVar8 - 1].u32 != 0) goto LAB_00751e6e;
            bVar5 = (local_58->m).c[0].r[uVar8 - 1].u32 == 1;
            break;
          case Int64:
          case UInt64:
            if ((pSVar6->m).c[0].r[uVar8 - 1].u64 != 0) goto LAB_00751e6e;
            bVar5 = (local_58->m).c[0].r[uVar8 - 1].u64 == 1;
            break;
          case Half:
            uVar2 = (pSVar6->m).c[0].r[uVar8 - 1].u32;
            uVar9 = uVar2 >> 10 & 0x1f;
            uVar11 = uVar2 & 0x3ff;
            if (uVar9 == 0x1f) {
              uVar9 = 0;
              if (uVar11 != 0) {
                uVar9 = (uVar2 & 0xffff) << 0xd;
              }
              uVar9 = uVar9 | 0x7f800000;
            }
            else {
              if (uVar9 == 0) {
                if (uVar11 == 0) {
                  uVar9 = 0;
                  goto LAB_00751e65;
                }
                uVar2 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> uVar2 == 0; uVar2 = uVar2 - 1) {
                  }
                }
                uVar9 = (uVar2 ^ 0xffffffe0) + 0x17;
                uVar11 = uVar11 << (~(byte)uVar2 + 0xb & 0x1f) & 0x1fffbfe;
              }
              uVar9 = uVar9 * 0x800000 + 0x38000000 | uVar11 << 0xd;
            }
LAB_00751e65:
            if ((uVar9 & 0x7fffffff) != 0) goto LAB_00751e6e;
            uVar2 = (local_58->m).c[0].r[uVar8 - 1].u32;
            uVar9 = (uVar2 & 0xffff) >> 0xf;
            uVar11 = uVar2 >> 10 & 0x1f;
            uVar12 = uVar2 & 0x3ff;
            if (uVar11 == 0x1f) {
              uVar9 = uVar9 << 0x1f;
              if (uVar12 != 0) {
                uVar9 = uVar9 | (uVar2 & 0xffff) << 0xd;
              }
              fVar10 = (float)(uVar9 | 0x7f800000);
            }
            else {
              if (uVar11 == 0) {
                if (uVar12 == 0) {
                  fVar10 = (float)(uVar9 << 0x1f);
                  goto LAB_00751f08;
                }
                uVar2 = 0x1f;
                if (uVar12 != 0) {
                  for (; uVar12 >> uVar2 == 0; uVar2 = uVar2 - 1) {
                  }
                }
                uVar11 = (uVar2 ^ 0xffffffe0) + 0x17;
                uVar12 = uVar12 << (~(byte)uVar2 + 0xb & 0x1f) & 0x1fffbfe;
              }
              fVar10 = (float)(uVar11 * 0x800000 + 0x38000000 | uVar9 << 0x1f | uVar12 << 0xd);
            }
LAB_00751f08:
            bVar5 = fVar10 == 1.0;
LAB_00751f11:
            bVar5 = (bool)(-bVar5 & 1);
            break;
          case Float:
            fVar10 = (pSVar6->m).c[0].r[uVar8 - 1].f32;
            if ((fVar10 == 0.0) && (!NAN(fVar10))) {
              fVar10 = (local_58->m).c[0].r[uVar8 - 1].f32;
              goto LAB_00751f08;
            }
            goto LAB_00751e6e;
          case Double:
            dVar1 = (pSVar6->m).c[0].r[uVar8 - 1].f64;
            if ((dVar1 == 0.0) && (!NAN(dVar1))) {
              bVar5 = (local_58->m).c[0].r[uVar8 - 1].f64 == 1.0;
              goto LAB_00751f11;
            }
LAB_00751e6e:
            bVar5 = false;
          }
        } while ((bVar5 != false) && (bVar13 = uVar8 < type_00->vecsize, uVar8 = uVar8 + 1, bVar13))
        ;
      }
      if (bVar5 == false) {
        return false;
      }
      type_to_glsl_constructor_abi_cxx11_(&local_50,this,type);
      ::std::__cxx11::string::operator=((string *)op,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        return bVar5;
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::to_trivial_mix_op(const SPIRType &type, string &op, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto *cleft = maybe_get<SPIRConstant>(left);
	auto *cright = maybe_get<SPIRConstant>(right);
	auto &lerptype = expression_type(lerp);

	// If our targets aren't constants, we cannot use construction.
	if (!cleft || !cright)
		return false;

	// If our targets are spec constants, we cannot use construction.
	if (cleft->specialization || cright->specialization)
		return false;

	auto &value_type = get<SPIRType>(cleft->constant_type);

	if (lerptype.basetype != SPIRType::Boolean)
		return false;
	if (value_type.basetype == SPIRType::Struct || is_array(value_type))
		return false;
	if (!backend.use_constructor_splatting && value_type.vecsize != lerptype.vecsize)
		return false;

	// Only valid way in SPIR-V 1.4 to use matrices in select is a scalar select.
	// matrix(scalar) constructor fills in diagnonals, so gets messy very quickly.
	// Just avoid this case.
	if (value_type.columns > 1)
		return false;

	// If our bool selects between 0 and 1, we can cast from bool instead, making our trivial constructor.
	bool ret = true;
	for (uint32_t row = 0; ret && row < value_type.vecsize; row++)
	{
		switch (type.basetype)
		{
		case SPIRType::Short:
		case SPIRType::UShort:
			ret = cleft->scalar_u16(0, row) == 0 && cright->scalar_u16(0, row) == 1;
			break;

		case SPIRType::Int:
		case SPIRType::UInt:
			ret = cleft->scalar(0, row) == 0 && cright->scalar(0, row) == 1;
			break;

		case SPIRType::Half:
			ret = cleft->scalar_f16(0, row) == 0.0f && cright->scalar_f16(0, row) == 1.0f;
			break;

		case SPIRType::Float:
			ret = cleft->scalar_f32(0, row) == 0.0f && cright->scalar_f32(0, row) == 1.0f;
			break;

		case SPIRType::Double:
			ret = cleft->scalar_f64(0, row) == 0.0 && cright->scalar_f64(0, row) == 1.0;
			break;

		case SPIRType::Int64:
		case SPIRType::UInt64:
			ret = cleft->scalar_u64(0, row) == 0 && cright->scalar_u64(0, row) == 1;
			break;

		default:
			ret = false;
			break;
		}
	}

	if (ret)
		op = type_to_glsl_constructor(type);
	return ret;
}